

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgVector.h
# Opt level: O2

dgTemplateVector<float> __thiscall
dgTemplateVector<float>::operator*(dgTemplateVector<float> *this,dgTemplateVector<float> *B)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  dgTemplateVector<float> dVar8;
  
  uVar1._0_4_ = this->m_y;
  uVar1._4_4_ = this->m_z;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  uVar2._0_4_ = B->m_y;
  uVar2._4_4_ = B->m_z;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar3 = vpermt2ps_avx512vl(auVar5,_DAT_00f483c0,ZEXT416((uint)this->m_x));
  auVar4 = vpermi2ps_avx512vl(_DAT_00f483c0,auVar6,ZEXT416((uint)B->m_x));
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(B->m_x * (float)(undefined4)uVar1)),
                           ZEXT416((uint)this->m_x),auVar6);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)this->m_w),0x10);
  auVar7._0_4_ = (float)(undefined4)uVar2 * auVar3._0_4_;
  auVar7._4_4_ = (float)uVar2._4_4_ * auVar3._4_4_;
  auVar7._8_4_ = auVar3._8_4_ * 0.0;
  auVar7._12_4_ = auVar3._12_4_ * 0.0;
  auVar3 = vfmsub213ps_fma(auVar4,auVar5,auVar7);
  dVar8._0_8_ = auVar3._0_8_;
  dVar8._8_8_ = auVar6._0_8_;
  return dVar8;
}

Assistant:

dgTemplateVector<T> dgTemplateVector<T>::operator* (const dgTemplateVector<T> &B) const
{
	return dgTemplateVector<T> (m_y * B.m_z - m_z * B.m_y,
 							    m_z * B.m_x - m_x * B.m_z,
								m_x * B.m_y - m_y * B.m_x, m_w);
}